

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O3

JsErrorCode
WScriptJsrt::FetchImportedModuleHelper
          (JsModuleRecord referencingModule,JsValueRef specifier,
          JsModuleRecord *dependentModuleRecord,LPCSTR refdir)

{
  MessageQueue *this;
  undefined8 uVar1;
  JsErrorCode JVar2;
  DWORD DVar3;
  size_t sVar4;
  char *pcVar5;
  iterator iVar6;
  mapped_type *fullDirNarrow;
  mapped_type *ppvVar7;
  mapped_type *pmVar8;
  ModuleMessage *pMVar9;
  char local_1b8 [8];
  char fullPath [260];
  ListEntry local_a8;
  undefined1 auStack_98 [8];
  AutoString specifierStr;
  string specifierFullPath;
  string pathKey;
  JsModuleRecord moduleRecord;
  
  pathKey.field_2._8_8_ = 0;
  specifierStr.data._0_5_ = 0;
  specifierStr._13_8_ = 0;
  auStack_98 = (undefined1  [8])0x0;
  specifierStr.length._0_5_ = 0;
  specifierStr.length._5_3_ = 0;
  *dependentModuleRecord = (JsModuleRecord)0x0;
  JVar2 = AutoString::Initialize((AutoString *)auStack_98,specifier);
  if (JVar2 != JsNoError) {
    JVar2 = (JsErrorCode)specifierStr.data_wide;
    goto LAB_00112a44;
  }
  pcVar5 = "";
  if (refdir != (LPCSTR)0x0) {
    pcVar5 = refdir;
  }
  specifierStr._24_8_ = &specifierFullPath._M_string_length;
  sVar4 = strlen(pcVar5);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&specifierStr.errorCode,pcVar5,pcVar5 + sVar4);
  std::__cxx11::string::append((char *)&specifierStr.errorCode);
  pcVar5 = _fullpath(local_1b8,(char *)specifierStr._24_8_,0x104);
  if (pcVar5 == (char *)0x0) {
    JVar2 = JsErrorInvalidArgument;
  }
  else {
    specifierFullPath.field_2._8_8_ = &pathKey._M_string_length;
    sVar4 = strlen(local_1b8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&specifierFullPath.field_2 + 8),local_1b8,local_1b8 + sVar4);
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::find(&moduleRecordMap_abi_cxx11_._M_t,
                   (key_type *)((long)&specifierFullPath.field_2 + 8));
    if ((size_type *)specifierFullPath.field_2._8_8_ != &pathKey._M_string_length) {
      operator_delete((void *)specifierFullPath.field_2._8_8_);
    }
    if ((_Rb_tree_header *)iVar6._M_node ==
        &moduleRecordMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtInitializeModuleRecord)
                        (referencingModule,specifier,(JsModuleRecord *)((long)&pathKey.field_2 + 8))
      ;
      if (JVar2 == JsNoError) {
        fullDirNarrow =
             std::
             map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&moduleDirMap_abi_cxx11_,(key_type *)((long)&pathKey.field_2 + 8));
        GetDir(local_1b8,fullDirNarrow);
        specifierFullPath.field_2._8_8_ = &pathKey._M_string_length;
        sVar4 = strlen(local_1b8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&specifierFullPath.field_2 + 8),local_1b8,local_1b8 + sVar4);
        uVar1 = pathKey.field_2._8_8_;
        ppvVar7 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                  ::operator[](&moduleRecordMap_abi_cxx11_,
                               (key_type *)((long)&specifierFullPath.field_2 + 8));
        *ppvVar7 = (mapped_type)uVar1;
        pmVar8 = std::
                 map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
                 ::operator[](&moduleErrMap,(key_type *)((long)&pathKey.field_2 + 8));
        *pmVar8 = ImportedModule;
        pMVar9 = ModuleMessage::Create
                           (referencingModule,specifier,
                            (string *)((long)&specifierFullPath.field_2 + 8));
        this = messageQueue;
        if (pMVar9 != (ModuleMessage *)0x0) {
          DVar3 = GetTickCount();
          local_a8.time = DVar3 + (pMVar9->super_MessageBase).m_time;
          (pMVar9->super_MessageBase).m_time = local_a8.time;
          local_a8.message = &pMVar9->super_MessageBase;
          SortedList<MessageQueue::ListEntry>::Insert(&this->m_queue,&local_a8);
          *dependentModuleRecord = (JsModuleRecord)pathKey.field_2._8_8_;
          if ((size_type *)specifierFullPath.field_2._8_8_ != &pathKey._M_string_length) {
            operator_delete((void *)specifierFullPath.field_2._8_8_);
          }
          goto LAB_00112a0b;
        }
        if ((size_type *)specifierFullPath.field_2._8_8_ != &pathKey._M_string_length) {
          operator_delete((void *)specifierFullPath.field_2._8_8_);
        }
        JVar2 = JsErrorOutOfMemory;
      }
    }
    else {
      *dependentModuleRecord = *(JsModuleRecord *)(iVar6._M_node + 2);
LAB_00112a0b:
      JVar2 = JsNoError;
    }
  }
  if ((size_type *)specifierStr._24_8_ != &specifierFullPath._M_string_length) {
    operator_delete((void *)specifierStr._24_8_);
  }
LAB_00112a44:
  AutoString::~AutoString((AutoString *)auStack_98);
  return JVar2;
}

Assistant:

JsErrorCode WScriptJsrt::FetchImportedModuleHelper(JsModuleRecord referencingModule,
    JsValueRef specifier, __out JsModuleRecord* dependentModuleRecord, LPCSTR refdir)
{
    JsModuleRecord moduleRecord = JS_INVALID_REFERENCE;
    AutoString specifierStr;
    *dependentModuleRecord = nullptr;

    if (specifierStr.Initialize(specifier) != JsNoError)
    {
        return specifierStr.GetError();
    }

    char fullPath[_MAX_PATH];
    std::string specifierFullPath = refdir ? refdir : "";
    specifierFullPath += *specifierStr;
    if (_fullpath(fullPath, specifierFullPath.c_str(), _MAX_PATH) == nullptr)
    {
        return JsErrorInvalidArgument;
    }

    auto moduleEntry = moduleRecordMap.find(std::string(fullPath));
    if (moduleEntry != moduleRecordMap.end())
    {
        *dependentModuleRecord = moduleEntry->second;
        return JsNoError;
    }

    JsErrorCode errorCode = ChakraRTInterface::JsInitializeModuleRecord(referencingModule, specifier, &moduleRecord);
    if (errorCode == JsNoError)
    {
        GetDir(fullPath, &moduleDirMap[moduleRecord]);
        std::string pathKey = std::string(fullPath);
        moduleRecordMap[pathKey] = moduleRecord;
        moduleErrMap[moduleRecord] = ImportedModule;
        ModuleMessage* moduleMessage = WScriptJsrt::ModuleMessage::Create(referencingModule, specifier, &pathKey);
        if (moduleMessage == nullptr)
        {
            return JsErrorOutOfMemory;
        }
        WScriptJsrt::PushMessage(moduleMessage);
        *dependentModuleRecord = moduleRecord;
    }
    return errorCode;
}